

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O1

void rng_init(RNG_state *newstate,int seed)

{
  state_t gen;
  sha1_ctx_s ctx;
  uchar local_88 [17];
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  sha1_ctx local_6c;
  
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = '\0';
  local_88[9] = '\0';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  local_88[0xc] = '\0';
  local_88[0xd] = '\0';
  local_88[0xe] = '\0';
  local_88[0xf] = '\0';
  local_88[0x10] = (uchar)((uint)seed >> 0x18);
  local_77 = (undefined1)((uint)seed >> 0x10);
  local_76 = (undefined1)((uint)seed >> 8);
  local_75 = (undefined1)seed;
  local_6c.count[0] = 0;
  local_6c.count[1] = 0;
  local_6c.hash[0] = 0x67452301;
  local_6c.hash[1] = 0xefcdab89;
  local_6c.hash[2] = 0x98badcfe;
  local_6c.hash[3] = 0x10325476;
  local_6c.hash[4] = 0xc3d2e1f0;
  sha1_hash(local_88,0x14,&local_6c);
  sha1_end(newstate,&local_6c);
  return;
}

Assistant:

void rng_init(RNG_state *newstate, int seed)
{
  struct sha1_context ctx;
  struct state_t gen;
  int i;

  for (i=0; i < 16; i++) 
    gen.state[i] = 0;
  gen.state[16] = 0xFF & (seed >> 24);
  gen.state[17] = 0xFF & (seed >> 16);
  gen.state[18] = 0xFF & (seed >> 8);
  gen.state[19] = 0xFF & (seed >> 0);
  
  sha1_begin(&ctx);
  sha1_hash(gen.state, 20, &ctx);
  sha1_end(newstate, &ctx);
}